

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
          (QPodArrayOps<QLineF> *this,qsizetype i,QLineF *args)

{
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  bool bVar6;
  qsizetype qVar7;
  QLineF *pQVar8;
  qreal *in_RDX;
  long in_RSI;
  QArrayDataPointer<QLineF> *in_RDI;
  long in_FS_OFFSET;
  QLineF *where;
  GrowthPosition pos;
  bool detach;
  QLineF tmp;
  QArrayDataPointer<QLineF> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar10;
  QArrayDataPointer<QLineF> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar6 = QArrayDataPointer<QLineF>::needsDetach(in_stack_ffffffffffffffb0);
  uVar10 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffffbc);
  if (!bVar6) {
    if ((in_RSI == in_RDI->size) &&
       (qVar7 = QArrayDataPointer<QLineF>::freeSpaceAtEnd
                          ((QArrayDataPointer<QLineF> *)CONCAT44(uVar10,in_stack_ffffffffffffffb8)),
       qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QLineF>::end(in_stack_ffffffffffffffb0);
      (pQVar8->pt1).xp = *in_RDX;
      (pQVar8->pt1).yp = in_RDX[1];
      (pQVar8->pt2).xp = in_RDX[2];
      (pQVar8->pt2).yp = in_RDX[3];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_003f3a89;
    }
    if ((in_RSI == 0) &&
       (qVar7 = QArrayDataPointer<QLineF>::freeSpaceAtBegin
                          ((QArrayDataPointer<QLineF> *)CONCAT44(uVar10,in_stack_ffffffffffffffb8)),
       qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QLineF>::begin((QArrayDataPointer<QLineF> *)0x3f3966);
      pQVar8[-1].pt1.xp = *in_RDX;
      pQVar8[-1].pt1.yp = in_RDX[1];
      pQVar8[-1].pt2.xp = in_RDX[2];
      pQVar8[-1].pt2.yp = in_RDX[3];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_003f3a89;
    }
  }
  qVar2 = *in_RDX;
  qVar3 = in_RDX[1];
  qVar4 = in_RDX[2];
  qVar5 = in_RDX[3];
  uVar9 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar9 = 1;
  }
  QArrayDataPointer<QLineF>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QLineF **)CONCAT44(uVar10,uVar9),in_stack_ffffffffffffffb0);
  pQVar8 = createHole((QPodArrayOps<QLineF> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
                      (qsizetype)in_RDX,CONCAT44(uVar10,uVar9));
  (pQVar8->pt1).xp = qVar2;
  (pQVar8->pt1).yp = qVar3;
  (pQVar8->pt2).xp = qVar4;
  (pQVar8->pt2).yp = qVar5;
LAB_003f3a89:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }